

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O1

int jp2_cdef_putdata(jp2_box_t *box,jas_stream_t *out)

{
  uint_fast8_t *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = jp2_putuint16(out,(box->data).bpcc.numcmpts);
  iVar5 = -1;
  if (iVar3 == 0) {
    if ((box->data).ftyp.majver != 0) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        puVar1 = (box->data).bpcc.bpcs;
        iVar3 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + uVar4 * 0x18));
        if (iVar3 != 0) {
          return -1;
        }
        iVar3 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + uVar4 * 0x18 + 8));
        if (iVar3 != 0) {
          return -1;
        }
        iVar3 = jp2_putuint16(out,*(uint_fast16_t *)(puVar1 + uVar4 * 0x18 + 0x10));
        if (iVar3 != 0) {
          return -1;
        }
        bVar2 = uVar6 < (box->data).ftyp.majver;
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int jp2_cdef_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_cdef_t *cdef = &box->data.cdef;
	unsigned int i;
	jp2_cdefchan_t *ent;

	if (jp2_putuint16(out, cdef->numchans)) {
		return -1;
	}

	for (i = 0; i < cdef->numchans; ++i) {
		ent = &cdef->ents[i];
		if (jp2_putuint16(out, ent->channo) ||
		  jp2_putuint16(out, ent->type) ||
		  jp2_putuint16(out, ent->assoc)) {
			return -1;
		}
	}
	return 0;
}